

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_chunk(Integer g_a,Integer *chunk)

{
  ushort uVar1;
  global_array_t *pgVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set chunk on array that has been allocated",0);
  }
  if (GA[lVar4].ndim < 1) {
    pnga_error("Dimensions must be set before chunk array is specified",0);
  }
  pgVar2 = GA;
  if (chunk != (Integer *)0x0) {
    uVar1 = GA[lVar4].ndim;
    uVar3 = 0;
    if ((short)uVar1 < 1) {
      uVar1 = 0;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      pgVar2[lVar4].chunk[uVar3] = chunk[uVar3];
    }
  }
  return;
}

Assistant:

void pnga_set_chunk(Integer g_a, Integer *chunk)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set chunk on array that has been allocated",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before chunk array is specified",0);
  if (chunk) {
    for (i=0; i<GA[ga_handle].ndim; i++) {
      GA[ga_handle].chunk[i] = (C_Integer)chunk[i];
    }
  }
}